

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestP4.cxx
# Opt level: O2

string * __thiscall
cmCTestP4::GetWorkingRevision_abi_cxx11_(string *__return_storage_ptr__,cmCTestP4 *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  bool bVar2;
  vector<const_char_*,_std::allocator<const_char_*>_> p4_identify;
  string rev;
  string source;
  OutputLogger err;
  IdentifyParser out;
  allocator local_1c9;
  _Vector_base<const_char_*,_std::allocator<const_char_*>_> local_1c8;
  string local_1b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_190;
  LineParser local_170;
  IdentifyParser local_130;
  
  local_1c8._M_impl.super__Vector_impl_data._M_start = (char **)0x0;
  local_1c8._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1c8._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  SetP4Options(this,(vector<const_char_*,_std::allocator<const_char_*>_> *)&local_1c8);
  local_130.super_LineParser.super_OutputParser._vptr_OutputParser = (_func_int **)0x52540f;
  std::vector<char_const*,std::allocator<char_const*>>::emplace_back<char_const*>
            ((vector<char_const*,std::allocator<char_const*>> *)&local_1c8,(char **)&local_130);
  local_130.super_LineParser.super_OutputParser._vptr_OutputParser = (_func_int **)0x5253f4;
  std::vector<char_const*,std::allocator<char_const*>>::emplace_back<char_const*>
            ((vector<char_const*,std::allocator<char_const*>> *)&local_1c8,(char **)&local_130);
  local_130.super_LineParser.super_OutputParser._vptr_OutputParser = (_func_int **)0x56dcc8;
  std::vector<char_const*,std::allocator<char_const*>>::emplace_back<char_const*>
            ((vector<char_const*,std::allocator<char_const*>> *)&local_1c8,(char **)&local_130);
  local_130.super_LineParser.super_OutputParser._vptr_OutputParser = (_func_int **)0x525417;
  std::vector<char_const*,std::allocator<char_const*>>::emplace_back<char_const*>
            ((vector<char_const*,std::allocator<char_const*>> *)&local_1c8,(char **)&local_130);
  std::operator+(&local_190,&(this->super_cmCTestGlobalVC).super_cmCTestVC.SourceDirectory,
                 "/...#have");
  local_130.super_LineParser.super_OutputParser._vptr_OutputParser =
       (_func_int **)local_190._M_dataplus._M_p;
  std::vector<char_const*,std::allocator<char_const*>>::emplace_back<char_const*>
            ((vector<char_const*,std::allocator<char_const*>> *)&local_1c8,(char **)&local_130);
  local_130.super_LineParser.super_OutputParser._vptr_OutputParser = (_func_int **)0x0;
  std::vector<char_const*,std::allocator<char_const*>>::emplace_back<char_const*>
            ((vector<char_const*,std::allocator<char_const*>> *)&local_1c8,(char **)&local_130);
  paVar1 = &local_1b0.field_2;
  local_1b0._M_string_length = 0;
  local_1b0.field_2._M_local_buf[0] = '\0';
  local_1b0._M_dataplus._M_p = (pointer)paVar1;
  IdentifyParser::IdentifyParser(&local_130,this,"p4_changes-out> ",&local_1b0);
  cmProcessTools::OutputLogger::OutputLogger
            ((OutputLogger *)&local_170,(this->super_cmCTestGlobalVC).super_cmCTestVC.Log,
             "p4_changes-err> ");
  bVar2 = cmCTestVC::RunChild((cmCTestVC *)this,local_1c8._M_impl.super__Vector_impl_data._M_start,
                              (OutputParser *)&local_130,&local_170.super_OutputParser,(char *)0x0);
  if (bVar2) {
    if (local_1b0._M_string_length == 0) {
      std::__cxx11::string::string((string *)__return_storage_ptr__,"0",&local_1c9);
    }
    else {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1b0._M_dataplus._M_p == paVar1) {
        (__return_storage_ptr__->field_2)._M_allocated_capacity =
             CONCAT71(local_1b0.field_2._M_allocated_capacity._1_7_,
                      local_1b0.field_2._M_local_buf[0]);
        *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = local_1b0.field_2._8_8_;
      }
      else {
        (__return_storage_ptr__->_M_dataplus)._M_p = local_1b0._M_dataplus._M_p;
        (__return_storage_ptr__->field_2)._M_allocated_capacity =
             CONCAT71(local_1b0.field_2._M_allocated_capacity._1_7_,
                      local_1b0.field_2._M_local_buf[0]);
      }
      __return_storage_ptr__->_M_string_length = local_1b0._M_string_length;
      local_1b0._M_string_length = 0;
      local_1b0.field_2._M_local_buf[0] = '\0';
      local_1b0._M_dataplus._M_p = (pointer)paVar1;
    }
  }
  else {
    std::__cxx11::string::string((string *)__return_storage_ptr__,"<unknown>",&local_1c9);
  }
  cmProcessTools::LineParser::~LineParser(&local_170);
  IdentifyParser::~IdentifyParser(&local_130);
  std::__cxx11::string::~string((string *)&local_1b0);
  std::__cxx11::string::~string((string *)&local_190);
  std::_Vector_base<const_char_*,_std::allocator<const_char_*>_>::~_Vector_base(&local_1c8);
  return __return_storage_ptr__;
}

Assistant:

std::string cmCTestP4::GetWorkingRevision()
{
  std::vector<char const*> p4_identify;
  SetP4Options(p4_identify);

  p4_identify.push_back("changes");
  p4_identify.push_back("-m");
  p4_identify.push_back("1");
  p4_identify.push_back("-t");

  std::string source = this->SourceDirectory + "/...#have";
  p4_identify.push_back(source.c_str());
  p4_identify.push_back(0);

  std::string rev;
  IdentifyParser out(this, "p4_changes-out> ", rev);
  OutputLogger err(this->Log, "p4_changes-err> ");

  bool result = RunChild(&p4_identify[0], &out, &err);

  // If there was a problem contacting the server return "<unknown>"
  if(!result)
    {
    return "<unknown>";
    }

  if(rev.empty())
    {
    return "0";
    }
  else
    {
    return rev;
    }
}